

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1551.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int local_24;
  CURLcode ec;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  local_24 = 0;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib1551.c"
                  ,0x21,iVar2,uVar3);
    local_24 = iVar2;
  }
  if (local_24 == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 != 0) {
      curl_easy_setopt(lVar4,0x2712,URL);
      curl_easy_setopt(lVar4,0x34,1);
      curl_easy_setopt(lVar4,0x29,1);
      curl_easy_perform(lVar4);
      curl_mfprintf(_stderr,"****************************** Do it again\n");
      local_24 = curl_easy_perform(lVar4);
      curl_easy_cleanup(lVar4);
    }
    curl_global_cleanup();
    URL_local._4_4_ = local_24;
  }
  else {
    URL_local._4_4_ = local_24;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);
  curl = curl_easy_init();
  if(curl) {
    curl_easy_setopt(curl, CURLOPT_URL, URL);
    curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
    curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
    res = curl_easy_perform(curl);

    fprintf(stderr, "****************************** Do it again\n");
    res = curl_easy_perform(curl);
    curl_easy_cleanup(curl);
  }
  curl_global_cleanup();
  return (int)res;
}